

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
::erase_empty_row(Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
                  *this,Index rowIndex)

{
  pointer ppVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_20;
  iterator it;
  ID_index rowID;
  Index rowIndex_local;
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  *this_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._0_4_ =
       rowIndex;
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ =
       rowIndex;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(&(this->
               super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
               ).indexToRow_,
              (key_type *)
              ((long)&it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 4));
  ppVar1 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *
                        )&local_20);
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._0_4_ =
       ppVar1->second;
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::erase(&(this->
           super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
           ).rowToIndex_,(key_type *)&it);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::erase(&(this->
           super_template_Base_swap_option<Boundary_matrix<Matrix<Boundary_options_with_row_access<false,_(Column_types)7,_false,_true,_true,_true,_true>_>_>_>
           ).indexToRow_,(iterator)local_20._M_cur);
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::erase_empty_row(Index rowIndex)
{
  //computes real row index and erases it if necessary from the row swap map containers
  ID_index rowID = rowIndex;
  if constexpr (activeSwapOption) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = Swap_opt::indexToRow_.find(rowIndex);
      rowID = it->second;
      Swap_opt::rowToIndex_.erase(rowID);
      Swap_opt::indexToRow_.erase(it);
    } else {
      rowID = Swap_opt::indexToRow_[rowIndex];
    }
  }

  if constexpr (Master_matrix::Option_list::has_row_access && Master_matrix::Option_list::has_removable_rows) {
    RA_opt::erase_empty_row(rowID);
  }
}